

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-parser.c
# Opt level: O1

bc_trie_t * blogc_source_parse(char *src,size_t src_len,int toctree_maxdepth,bc_error_t **err)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  bc_trie_t *trie;
  bc_error_t *pbVar5;
  void *pvVar6;
  char *pcVar7;
  size_t sVar8;
  undefined4 in_register_00000014;
  int iVar9;
  char *pcVar10;
  bc_slist_t **headers_00;
  long lVar11;
  ulong uVar12;
  ulong current;
  size_t sVar13;
  bc_slist_t *headers;
  char *endl;
  char *description;
  char *first_header;
  size_t end_excerpt;
  char *endptr;
  char *local_88;
  ulong local_80;
  bc_slist_t *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  long local_58;
  size_t local_50;
  ulong local_48;
  long local_40;
  char *local_38;
  
  local_58 = CONCAT44(in_register_00000014,toctree_maxdepth);
  if (err == (bc_error_t **)0x0) {
    return (bc_trie_t *)0x0;
  }
  if (*err != (bc_error_t *)0x0) goto LAB_00104ea4;
  local_50 = 0;
  trie = bc_trie_new(free);
  local_40 = 1 - src_len;
  iVar9 = 1;
  local_88 = (char *)0x0;
  local_80 = 0;
  uVar12 = 0xffffffffffffffff;
  do {
    current = uVar12 + 1;
    sVar13 = src_len;
    if (src_len <= current) goto LAB_00104e0a;
    if (6 < iVar9 - 1U) goto LAB_00104dd1;
    bVar1 = src[uVar12 + 1];
    switch(iVar9) {
    case 1:
      iVar9 = 1;
      if ((0x20 < bVar1) || ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) {
        if ((byte)(bVar1 + 0xbf) < 0x1a) {
          iVar9 = 2;
          local_80 = current;
        }
        else {
          if (bVar1 != 0x2d) {
            pcVar10 = "Can\'t find a configuration key or the content separator.";
            goto LAB_001047a7;
          }
          iVar9 = 5;
        }
      }
      break;
    case 2:
      iVar9 = 2;
      if (((byte)(bVar1 + 0xbf) < 0x1a) || (bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10)) break;
      if (bVar1 == 0x3a) {
        pcVar10 = src + local_80;
        lVar11 = uVar12 - local_80;
        sVar13 = lVar11 + 1;
        local_88 = bc_strndup(pcVar10,sVar13);
        switch(lVar11) {
        case 6:
switchD_001048db_caseD_6:
          iVar4 = strncmp("CONTENT",pcVar10,7);
          if (iVar4 == 0) goto LAB_00104daf;
          if (0x12 < (long)sVar13) {
            if (sVar13 != 0x13) goto LAB_00104c88;
            goto switchD_001048db_caseD_12;
          }
          if (sVar13 == 10) goto switchD_001048db_caseD_9;
          if (sVar13 == 0xe) goto switchD_001048db_caseD_d;
          break;
        case 7:
          iVar4 = strncmp("FILENAME",pcVar10,8);
          if (iVar4 == 0) goto LAB_00104daf;
          if (0xd < (long)sVar13) {
            if (sVar13 == 0xe) goto switchD_001048db_caseD_d;
            goto LAB_00104c78;
          }
          if (sVar13 == 7) goto switchD_001048db_caseD_6;
          if (sVar13 == 10) goto switchD_001048db_caseD_9;
          break;
        case 9:
switchD_001048db_caseD_9:
          iVar4 = strncmp("PAGE_FIRST",pcVar10,10);
          if (iVar4 != 0) break;
          goto LAB_00104daf;
        case 0xd:
switchD_001048db_caseD_d:
          iVar4 = strncmp("DATE_FORMATTED",pcVar10,0xe);
          if (iVar4 == 0) goto LAB_00104daf;
          if (sVar13 == 10) goto switchD_001048db_caseD_9;
LAB_00104c78:
          if (sVar13 == 0x13) goto switchD_001048db_caseD_12;
LAB_00104c88:
          if (sVar13 == 0x14) goto switchD_001048db_caseD_13;
          break;
        case 0x12:
switchD_001048db_caseD_12:
          iVar4 = strncmp("DATE_LAST_FORMATTED",pcVar10,0x13);
          if (iVar4 == 0) goto LAB_00104daf;
          if (lVar11 == 9) goto switchD_001048db_caseD_9;
          break;
        case 0x13:
switchD_001048db_caseD_13:
          iVar4 = strncmp("DATE_FIRST_FORMATTED",pcVar10,0x14);
          if (iVar4 == 0) goto LAB_00104daf;
          if (sVar13 == 10) goto switchD_001048db_caseD_9;
          if (sVar13 == 0x13) goto switchD_001048db_caseD_12;
        }
        if ((lVar11 != 0xc) || (iVar4 = strncmp("PAGE_PREVIOUS",pcVar10,0xd), iVar4 != 0)) {
          if (sVar13 == 9) {
LAB_00104d54:
            iVar4 = strncmp("PAGE_NEXT",pcVar10,9);
            if ((iVar4 == 0) || (iVar4 = strncmp("PAGE_LAST",pcVar10,9), iVar4 == 0))
            goto LAB_00104daf;
          }
          else if (sVar13 == 0xc) {
            iVar4 = strncmp("PAGE_CURRENT",pcVar10,0xc);
            if (iVar4 == 0) goto LAB_00104daf;
            if (lVar11 == 8) goto LAB_00104d54;
          }
          if ((lVar11 != 0xc) || (iVar4 = strncmp("BLOGC_VERSION",pcVar10,0xd), iVar4 != 0)) {
            iVar9 = 3;
            break;
          }
        }
LAB_00104daf:
        pbVar5 = bc_error_new_printf(BLOGC_ERROR_SOURCE_PARSER,
                                     "\'%s\' variable is forbidden in source files. It will be set for you by the compiler."
                                     ,local_88);
      }
      else {
        pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,current,
                                 "Invalid configuration key.");
      }
      *err = pbVar5;
      break;
    case 3:
      if ((bVar1 == 10) || (bVar1 == 0xd)) {
        pcVar10 = bc_strdup("");
        bc_trie_insert(trie,local_88,pcVar10);
LAB_00104848:
        free(local_88);
        iVar9 = 1;
        local_88 = (char *)0x0;
      }
      else {
        iVar9 = 4;
        local_80 = current;
      }
      break;
    case 4:
      if ((bVar1 == 0xd) || (iVar9 = 4, bVar1 == 10)) {
        pcVar10 = bc_strndup(src + local_80,(uVar12 - local_80) + 1);
        pcVar7 = bc_str_strip(pcVar10);
        pcVar7 = bc_strdup(pcVar7);
        bc_trie_insert(trie,local_88,pcVar7);
        free(pcVar10);
        goto LAB_00104848;
      }
      break;
    case 5:
      if ((bVar1 == 10) || (bVar1 == 0xd)) {
        iVar9 = 6;
      }
      else {
        iVar9 = 5;
        if (bVar1 != 0x2d) {
          pcVar10 = "Invalid content separator. Must be more than one \'-\' characters.";
LAB_001047a7:
          pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,current,pcVar10);
          *err = pbVar5;
        }
      }
      break;
    case 6:
      iVar9 = 6;
      if ((bVar1 != 10) && (bVar1 != 0xd)) {
        iVar9 = 7;
        local_80 = current;
      }
      break;
    case 7:
      iVar9 = 7;
      if (uVar12 + local_40 == -1) {
        local_48 = src_len;
        pcVar10 = bc_strndup(src + local_80,src_len - local_80);
        bc_trie_insert(trie,"RAW_CONTENT",pcVar10);
        local_60 = (char *)0x0;
        local_68 = (char *)0x0;
        local_70 = (char *)0x0;
        local_78 = (bc_slist_t *)0x0;
        pvVar6 = bc_trie_lookup(trie,"TOCTREE");
        headers_00 = (bc_slist_t **)0x0;
        if (pvVar6 == (void *)0x0) {
          headers_00 = &local_78;
        }
        pcVar10 = blogc_content_parse(pcVar10,&local_50,&local_60,&local_68,&local_70,headers_00);
        if (local_60 != (char *)0x0) {
          pvVar6 = bc_trie_lookup(trie,"FIRST_HEADER");
          if (pvVar6 == (void *)0x0) {
            bc_trie_insert(trie,"FIRST_HEADER",local_60);
          }
          else {
            free(local_60);
          }
        }
        src_len = local_48;
        if (local_68 != (char *)0x0) {
          pvVar6 = bc_trie_lookup(trie,"DESCRIPTION");
          if (pvVar6 == (void *)0x0) {
            bc_trie_insert(trie,"DESCRIPTION",local_68);
          }
          else {
            free(local_68);
          }
        }
        if (local_78 != (bc_slist_t *)0x0) {
          pcVar7 = (char *)bc_trie_lookup(trie,"TOCTREE_MAXDEPTH");
          if (pcVar7 == (char *)0x0) {
LAB_00104b6a:
            pcVar7 = blogc_toctree_render(local_78,(int)local_58,local_70);
            blogc_toctree_free(local_78);
            bVar3 = false;
            if (pcVar7 != (char *)0x0) {
              bc_trie_insert(trie,"TOCTREE",pcVar7);
              bVar3 = false;
            }
          }
          else {
            local_58 = strtol(pcVar7,&local_38,10);
            bVar3 = false;
            bVar2 = true;
            if ((*pcVar7 != '\0') && (*local_38 != '\0')) {
              pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,current,
                                       "Invalid value for \'TOCTREE_MAXDEPTH\' variable: %s.",pcVar7
                                      );
              *err = pbVar5;
              blogc_toctree_free(local_78);
              free(local_70);
              free(pcVar10);
              bVar2 = false;
              bVar3 = true;
            }
            if (bVar2) goto LAB_00104b6a;
          }
          if (bVar3) break;
        }
        free(local_70);
        bc_trie_insert(trie,"CONTENT",pcVar10);
        if (local_50 == 0) {
          pcVar10 = bc_strdup(pcVar10);
        }
        else {
          pcVar10 = bc_strndup(pcVar10,local_50);
        }
        bc_trie_insert(trie,"EXCERPT",pcVar10);
      }
    }
LAB_00104dd1:
    uVar12 = current;
  } while (*err == (bc_error_t *)0x0);
  sVar13 = current + (*err == (bc_error_t *)0x0);
LAB_00104e0a:
  if ((*err != (bc_error_t *)0x0) || (sVar8 = bc_trie_size(trie), sVar8 != 0))
  goto switchD_00104e34_default;
  switch(iVar9) {
  case 1:
    pcVar10 = "Your source file is empty.";
    break;
  case 2:
    pcVar10 = "Your last configuration key is missing \':\' and the value";
    break;
  case 3:
    pcVar10 = "Configuration value not provided for \'%s\'.";
    goto LAB_00104e4f;
  case 4:
    pcVar10 = "No line ending after the configuration value for \'%s\'.";
LAB_00104e4f:
    pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,sVar13,pcVar10,local_88);
    goto LAB_00104e87;
  default:
    goto switchD_00104e34_default;
  }
  pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,sVar13,pcVar10);
LAB_00104e87:
  *err = pbVar5;
switchD_00104e34_default:
  if (*err != (bc_error_t *)0x0) {
    free(local_88);
    bc_trie_free(trie);
LAB_00104ea4:
    trie = (bc_trie_t *)0x0;
  }
  return trie;
}

Assistant:

bc_trie_t*
blogc_source_parse(const char *src, size_t src_len, int toctree_maxdepth,
    bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    size_t current = 0;
    size_t start = 0;
    size_t end_excerpt = 0;

    char *key = NULL;
    char *tmp = NULL;
    char *content = NULL;
    bc_trie_t *rv = bc_trie_new(free);

    blogc_source_parser_state_t state = SOURCE_START;

    while (current < src_len) {
        char c = src[current];

        switch (state) {

            case SOURCE_START:
                if (c == ' ' || c == '\t' || c == '\n' || c == '\r')
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = SOURCE_CONFIG_KEY;
                    start = current;
                    break;
                }
                if (c == '-') {
                    state = SOURCE_SEPARATOR;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current,
                    "Can't find a configuration key or the content separator.");
                break;

            case SOURCE_CONFIG_KEY:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (c == ':') {
                    key = bc_strndup(src + start, current - start);
                    if (((current - start == 8) &&
                         (0 == strncmp("FILENAME", src + start, 8))) ||
                        ((current - start == 7) &&
                         (0 == strncmp("CONTENT", src + start, 7))) ||
                        ((current - start == 14) &&
                         (0 == strncmp("DATE_FORMATTED", src + start, 14))) ||
                        ((current - start == 20) &&
                         (0 == strncmp("DATE_FIRST_FORMATTED", src + start, 20))) ||
                        ((current - start == 19) &&
                         (0 == strncmp("DATE_LAST_FORMATTED", src + start, 19))) ||
                        ((current - start == 10) &&
                         (0 == strncmp("PAGE_FIRST", src + start, 10))) ||
                        ((current - start == 13) &&
                         (0 == strncmp("PAGE_PREVIOUS", src + start, 13))) ||
                        ((current - start == 12) &&
                         (0 == strncmp("PAGE_CURRENT", src + start, 12))) ||
                        ((current - start == 9) &&
                         (0 == strncmp("PAGE_NEXT", src + start, 9))) ||
                        ((current - start == 9) &&
                         (0 == strncmp("PAGE_LAST", src + start, 9))) ||
                        ((current - start == 13) &&
                         (0 == strncmp("BLOGC_VERSION", src + start, 13))))
                    {
                        *err = bc_error_new_printf(BLOGC_ERROR_SOURCE_PARSER,
                            "'%s' variable is forbidden in source files. It will "
                            "be set for you by the compiler.", key);
                        break;
                    }
                    state = SOURCE_CONFIG_VALUE_START;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Invalid configuration key.");
                break;

            case SOURCE_CONFIG_VALUE_START:
                if (c != '\n' && c != '\r') {
                    state = SOURCE_CONFIG_VALUE;
                    start = current;
                    break;
                }
                bc_trie_insert(rv, key, bc_strdup(""));
                free(key);
                key = NULL;
                state = SOURCE_START;
                break;

            case SOURCE_CONFIG_VALUE:
                if (c == '\n' || c == '\r') {
                    tmp = bc_strndup(src + start, current - start);
                    bc_trie_insert(rv, key, bc_strdup(bc_str_strip(tmp)));
                    free(tmp);
                    free(key);
                    key = NULL;
                    state = SOURCE_START;
                }
                break;

            case SOURCE_SEPARATOR:
                if (c == '-')
                    break;
                if (c == '\n' || c == '\r') {
                    state = SOURCE_CONTENT_START;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current,
                    "Invalid content separator. Must be more than one '-' characters.");
                break;

            case SOURCE_CONTENT_START:
                if (c == '\n' || c == '\r')
                    break;
                start = current;
                state = SOURCE_CONTENT;
                break;

            case SOURCE_CONTENT:
                if (current == (src_len - 1)) {
                    tmp = bc_strndup(src + start, src_len - start);
                    bc_trie_insert(rv, "RAW_CONTENT", tmp);
                    char *first_header = NULL;
                    char *description = NULL;
                    char *endl = NULL;
                    bc_slist_t *headers = NULL;
                    bool read_headers = (NULL == bc_trie_lookup(rv, "TOCTREE"));
                    content = blogc_content_parse(tmp, &end_excerpt,
                        &first_header, &description, &endl, read_headers ? &headers : NULL);
                    if (first_header != NULL) {
                        // do not override source-provided first_header.
                        if (NULL == bc_trie_lookup(rv, "FIRST_HEADER")) {
                            // no need to free, because we are transfering memory
                            // ownership to the trie.
                            bc_trie_insert(rv, "FIRST_HEADER", first_header);
                        }
                        else {
                            free(first_header);
                        }
                    }
                    if (description != NULL) {
                        // do not override source-provided description.
                        if (NULL == bc_trie_lookup(rv, "DESCRIPTION")) {
                            // no need to free, because we are transfering memory
                            // ownership to the trie.
                            bc_trie_insert(rv, "DESCRIPTION", description);
                        }
                        else {
                            free(description);
                        }
                    }
                    if (headers != NULL) {
                        // we already validated that the user do not defined TOCTREE
                        // manually in source file.
                        const char *maxdepth = bc_trie_lookup(rv, "TOCTREE_MAXDEPTH");
                        if (maxdepth != NULL) {
                            char *endptr;
                            toctree_maxdepth = strtol(maxdepth, &endptr, 10);
                            if (*maxdepth != '\0' && *endptr != '\0') {
                                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                                    current,
                                    "Invalid value for 'TOCTREE_MAXDEPTH' variable: %s.",
                                    maxdepth);
                                blogc_toctree_free(headers);
                                free(endl);
                                free(content);
                                break;
                            }
                        }
                        char *toctree = blogc_toctree_render(headers, toctree_maxdepth, endl);
                        blogc_toctree_free(headers);
                        if (toctree != NULL) {
                            bc_trie_insert(rv, "TOCTREE", toctree);
                        }
                    }
                    free(endl);
                    bc_trie_insert(rv, "CONTENT", content);
                    bc_trie_insert(rv, "EXCERPT", end_excerpt == 0 ?
                        bc_strdup(content) : bc_strndup(content, end_excerpt));
                }
                break;
        }

        if (*err != NULL)
            break;

        current++;
    }

    if (*err == NULL && bc_trie_size(rv) == 0) {

        // ok, nothing found in the config trie, but no error set either.
        // let's try to be nice with the users and provide some reasonable
        // output. :)
        switch (state) {
            case SOURCE_START:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Your source file is empty.");
                break;
            case SOURCE_CONFIG_KEY:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Your last configuration key is missing ':' and "
                    "the value");
                break;
            case SOURCE_CONFIG_VALUE_START:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Configuration value not provided for '%s'.",
                    key);
                break;
            case SOURCE_CONFIG_VALUE:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "No line ending after the configuration value for "
                    "'%s'.", key);
                break;
            case SOURCE_SEPARATOR:
            case SOURCE_CONTENT_START:
            case SOURCE_CONTENT:
                break;  // won't happen, and if even happen, shouldn't be fatal
        }
    }

    if (*err != NULL) {
        free(key);
        bc_trie_free(rv);
        return NULL;
    }

    return rv;
}